

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O3

void __thiscall OrPattern::saveXml(OrPattern *this,ostream *s)

{
  pointer ppDVar1;
  ulong uVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"<or_pat>\n",9);
  ppDVar1 = (this->orlist).super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->orlist).super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppDVar1) {
    uVar2 = 0;
    do {
      (*(ppDVar1[uVar2]->super_Pattern)._vptr_Pattern[0xd])(ppDVar1[uVar2],s);
      uVar2 = uVar2 + 1;
      ppDVar1 = (this->orlist).
                super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->orlist).
                                   super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar1 >> 3))
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"</or_pat>\n",10);
  return;
}

Assistant:

void OrPattern::saveXml(ostream &s) const

{
  s << "<or_pat>\n";
  for(int4 i=0;i<orlist.size();++i)
    orlist[i]->saveXml(s);
  s << "</or_pat>\n";
}